

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O1

uint xSAT_SolverClaNew(xSAT_Solver_t *s,Vec_Int_t *vLits,int fLearnt)

{
  iword *piVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  uint *puVar5;
  uint Entry;
  int iVar6;
  int iVar7;
  ulong uVar8;
  xSAT_Watcher_t *pxVar9;
  Vec_Int_t *pVVar10;
  xSAT_VecWatchList_t *pxVar11;
  int newsize;
  xSAT_WatchList_t *pxVar12;
  xSAT_Watcher_t xVar13;
  xSAT_Watcher_t xVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  xSAT_Watcher_t xVar18;
  uint *puVar19;
  
  if (vLits->nSize < 2) {
    __assert_fail("Vec_IntSize( vLits ) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                  ,0x115,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
  }
  if (1 < (uint)fLearnt) {
    __assert_fail("fLearnt == 0 || fLearnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                  ,0x116,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
  }
  Entry = xSAT_MemAppend(s->pMemory,fLearnt + vLits->nSize + 3);
  if (Entry == 0xffffffff) {
    puVar19 = (uint *)0x0;
  }
  else {
    puVar19 = s->pMemory->pData + (int)Entry;
  }
  *puVar19 = (*puVar19 & 0xfffffff0) + fLearnt * 8 | fLearnt;
  uVar16 = vLits->nSize;
  puVar19[1] = uVar16;
  memcpy(puVar19 + 2,vLits->pArray,(long)(int)uVar16 << 2);
  if (fLearnt == 0) {
    Vec_IntPush(s->vClauses,Entry);
    piVar1 = &(s->Stats).nClauseLits;
    *piVar1 = *piVar1 + (long)vLits->nSize;
  }
  else {
    Vec_IntPush(s->vLearnts,Entry);
    s->nStamp = s->nStamp + 1;
    if (vLits->nSize < 1) {
      uVar16 = 0;
    }
    else {
      pVVar10 = s->vLevels;
      piVar3 = vLits->pArray;
      lVar15 = 0;
      iVar6 = 0;
      do {
        uVar16 = piVar3[lVar15] >> 1;
        if (((int)uVar16 < 0) || (pVVar10->nSize <= (int)uVar16)) {
LAB_008e702c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar7 = pVVar10->pArray[uVar16];
        lVar17 = (long)iVar7;
        if ((lVar17 < 0) || (s->vStamp->nSize <= iVar7)) goto LAB_008e702c;
        piVar4 = s->vStamp->pArray;
        if (piVar4[lVar17] != s->nStamp) {
          piVar4[lVar17] = s->nStamp;
          iVar6 = iVar6 + 1;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < vLits->nSize);
      uVar16 = iVar6 << 4;
    }
    *puVar19 = *puVar19 & 0xf | uVar16;
    puVar19[(long)(int)puVar19[1] + 2] = 0;
    piVar1 = &(s->Stats).nLearntLits;
    *piVar1 = *piVar1 + (long)vLits->nSize;
    puVar19[(long)(int)puVar19[1] + 2] = puVar19[(long)(int)puVar19[1] + 2] + s->nClaActInc;
    if ((int)puVar19[(long)(int)puVar19[1] + 2] < 0) {
      pVVar10 = s->vLearnts;
      if (0 < pVVar10->nSize) {
        lVar15 = 0;
        do {
          puVar5 = s->pMemory->pData;
          puVar5 = puVar5 + (long)pVVar10->pArray[lVar15] +
                            (long)(int)puVar5[(long)pVVar10->pArray[lVar15] + 1] + 2;
          *puVar5 = *puVar5 >> 0xe;
          lVar15 = lVar15 + 1;
          pVVar10 = s->vLearnts;
        } while (lVar15 < pVVar10->nSize);
      }
      iVar7 = s->nClaActInc >> 0xe;
      iVar6 = 0x400;
      if (0x400 < iVar7) {
        iVar6 = iVar7;
      }
      s->nClaActInc = iVar6;
    }
  }
  uVar16 = puVar19[2];
  uVar8 = (long)(int)uVar16 ^ 1;
  iVar6 = (int)uVar8;
  if (vLits->nSize == 2) {
    pxVar11 = s->vBinWatches;
    if (pxVar11->nCap <= iVar6) goto LAB_008e704b;
    if (pxVar11->nSize <= iVar6) goto LAB_008e706a;
    if (pxVar11->pArray == (xSAT_WatchList_t *)0x0) goto LAB_008e7089;
    pxVar12 = pxVar11->pArray + uVar8;
    xVar13.Blocker = puVar19[3];
    xVar13.CRef = Entry;
    uVar2 = pxVar12->nCap;
    if (pxVar12->nSize == uVar2) {
      uVar8 = 4;
      if (3 < (int)uVar2) {
        uVar8 = (ulong)((uVar2 >> 1) * 3);
      }
      if (pxVar12->pArray == (xSAT_Watcher_t *)0x0) {
        pxVar9 = (xSAT_Watcher_t *)malloc(uVar8 * 8);
      }
      else {
        pxVar9 = (xSAT_Watcher_t *)realloc(pxVar12->pArray,uVar8 * 8);
      }
      pxVar12->pArray = pxVar9;
      if (pxVar9 == (xSAT_Watcher_t *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pxVar12->nCap * 9.5367431640625e-07,(double)(int)uVar8 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      pxVar12->nCap = (int)uVar8;
    }
    iVar6 = pxVar12->nSize;
    pxVar12->nSize = iVar6 + 1;
    pxVar12->pArray[iVar6] = xVar13;
    pxVar11 = s->vBinWatches;
  }
  else {
    pxVar11 = s->vWatches;
    if (pxVar11->nCap <= iVar6) goto LAB_008e704b;
    if (pxVar11->nSize <= iVar6) goto LAB_008e706a;
    if (pxVar11->pArray == (xSAT_WatchList_t *)0x0) goto LAB_008e7089;
    pxVar12 = pxVar11->pArray + iVar6;
    xVar14.Blocker = puVar19[3];
    xVar14.CRef = Entry;
    uVar2 = pxVar12->nCap;
    if (pxVar12->nSize == uVar2) {
      uVar8 = 4;
      if (3 < (int)uVar2) {
        uVar8 = (ulong)((uVar2 >> 1) * 3);
      }
      if (pxVar12->pArray == (xSAT_Watcher_t *)0x0) {
        pxVar9 = (xSAT_Watcher_t *)malloc(uVar8 * 8);
      }
      else {
        pxVar9 = (xSAT_Watcher_t *)realloc(pxVar12->pArray,uVar8 * 8);
      }
      pxVar12->pArray = pxVar9;
      if (pxVar9 == (xSAT_Watcher_t *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pxVar12->nCap * 9.5367431640625e-07,(double)(int)uVar8 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      pxVar12->nCap = (int)uVar8;
    }
    iVar6 = pxVar12->nSize;
    pxVar12->nSize = iVar6 + 1;
    pxVar12->pArray[iVar6] = xVar14;
    pxVar11 = s->vWatches;
  }
  iVar6 = (int)((long)(int)puVar19[3] ^ 1U);
  if (iVar6 < pxVar11->nCap) {
    if (iVar6 < pxVar11->nSize) {
      if (pxVar11->pArray != (xSAT_WatchList_t *)0x0) {
        pxVar12 = pxVar11->pArray + ((long)(int)puVar19[3] ^ 1U);
        xVar18.Blocker = uVar16;
        xVar18.CRef = Entry;
        uVar16 = pxVar12->nCap;
        if (pxVar12->nSize == uVar16) {
          uVar8 = 4;
          if (3 < (int)uVar16) {
            uVar8 = (ulong)((uVar16 >> 1) * 3);
          }
          if (pxVar12->pArray == (xSAT_Watcher_t *)0x0) {
            pxVar9 = (xSAT_Watcher_t *)malloc(uVar8 * 8);
          }
          else {
            pxVar9 = (xSAT_Watcher_t *)realloc(pxVar12->pArray,uVar8 * 8);
          }
          pxVar12->pArray = pxVar9;
          if (pxVar9 == (xSAT_Watcher_t *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)pxVar12->nCap * 9.5367431640625e-07,
                   (double)(int)uVar8 * 9.5367431640625e-07);
            fflush(_stdout);
          }
          pxVar12->nCap = (int)uVar8;
        }
        iVar6 = pxVar12->nSize;
        pxVar12->nSize = iVar6 + 1;
        pxVar12->pArray[iVar6] = xVar18;
        return Entry;
      }
LAB_008e7089:
      __assert_fail("v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                    ,0x78,"void xSAT_WatchListPush(xSAT_WatchList_t *, xSAT_Watcher_t)");
    }
LAB_008e706a:
    __assert_fail("iEntry < v->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                  ,0x107,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
  }
LAB_008e704b:
  __assert_fail("iEntry < v->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                ,0x106,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
}

Assistant:

unsigned xSAT_SolverClaNew( xSAT_Solver_t * s, Vec_Int_t * vLits , int fLearnt )
{
    unsigned CRef;
    xSAT_Clause_t * pCla;
    xSAT_Watcher_t w1;
    xSAT_Watcher_t w2;
    unsigned nWords;

    assert( Vec_IntSize( vLits ) > 1);
    assert( fLearnt == 0 || fLearnt == 1 );

    nWords = 3 + fLearnt + Vec_IntSize( vLits );
    CRef = xSAT_MemAppend( s->pMemory, nWords );
    pCla = xSAT_SolverReadClause( s, CRef );
    pCla->fLearnt = fLearnt;
    pCla->fMark = 0;
    pCla->fReallocd = 0;
    pCla->fCanBeDel = fLearnt;
    pCla->nSize = Vec_IntSize( vLits );
    memcpy( &( pCla->pData[0].Lit ), Vec_IntArray( vLits ), sizeof( int ) * Vec_IntSize( vLits ) );

    if ( fLearnt )
    {
        Vec_IntPush( s->vLearnts, CRef );
        pCla->nLBD = xSAT_SolverClaCalcLBD2( s, vLits );
        pCla->pData[pCla->nSize].Act = 0;
        s->Stats.nLearntLits += Vec_IntSize( vLits );
        xSAT_SolverClaActBump(s, pCla);
    }
    else
    {
        Vec_IntPush( s->vClauses, CRef );
        s->Stats.nClauseLits += Vec_IntSize( vLits );
    }

    w1.CRef = CRef;
    w2.CRef = CRef;
    w1.Blocker = pCla->pData[1].Lit;
    w2.Blocker = pCla->pData[0].Lit;

    if ( Vec_IntSize( vLits ) == 2 )
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    else
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    return CRef;
}